

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O1

void __thiscall Track::clear(Track *this)

{
  Track local_48;
  vector<Sector,_std::allocator<Sector>_> local_28;
  
  Track(&local_48,0);
  this->tracklen = local_48.tracklen;
  this->tracktime = local_48.tracktime;
  local_28.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.super__Vector_impl_data.
  _M_start = (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_28.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.super__Vector_impl_data.
  _M_finish = (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_28.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_28);
  std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_48.m_sectors);
  return;
}

Assistant:

void Track::clear()
{
    *this = Track();
}